

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Replicate<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,1,true>const,1,1>,Eigen::internal::add_assign_op<float,float>>
               (Matrix<float,_4,_1,_0,_4,_1> *dst,
               Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>
               *src,add_assign_op<float,_float> *func)

{
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType local_88;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
  local_80;
  unary_evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>,_Eigen::internal::IndexBased,_float>
  local_60;
  
  unary_evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>,_Eigen::internal::IndexBased,_float>
  ::unary_evaluator(&local_60,src);
  local_88.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>)
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>)dst;
  local_80.m_dst = &local_88;
  local_80.m_src = (SrcEvaluatorType *)&local_60;
  local_80.m_functor = func;
  local_80.m_dstExpr = dst;
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Replicate<const_Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_1,_true>,_1,_1>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_0,_4>
  ::run(&local_80);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}